

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float *local_78;
  float *local_70;
  float *local_68;
  
  pfVar14 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar2 * 4)) {
    uVar8 = 0;
  }
  else {
    pfVar22 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar12 = pfVar14 + lVar2 * 7;
    pfVar9 = pfVar14 + lVar2 * 6;
    pfVar11 = pfVar14 + lVar2 * 5;
    pfVar18 = pfVar14 + lVar2 * 4;
    local_68 = pfVar14 + lVar2 * 3;
    local_70 = pfVar14 + lVar2 * 2;
    local_78 = pfVar14 + lVar2;
    uVar8 = 0;
    pfVar21 = pfVar14;
    do {
      if (cols < 4) {
        fVar51 = 0.0;
        fVar53 = 0.0;
        fVar54 = 0.0;
        fVar55 = 0.0;
        fVar46 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar41 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar36 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar51 = 0.0;
        fVar53 = 0.0;
        fVar54 = 0.0;
        fVar55 = 0.0;
        lVar15 = 0;
        do {
          pfVar1 = pfVar22 + lVar15;
          fVar3 = *pfVar1;
          fVar4 = pfVar1[1];
          fVar5 = pfVar1[2];
          fVar6 = pfVar1[3];
          pfVar1 = pfVar21 + lVar15;
          fVar24 = fVar24 + *pfVar1 * fVar3;
          fVar25 = fVar25 + pfVar1[1] * fVar4;
          fVar26 = fVar26 + pfVar1[2] * fVar5;
          fVar27 = fVar27 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2;
          fVar37 = fVar37 + *pfVar1 * fVar3;
          fVar42 = fVar42 + pfVar1[1] * fVar4;
          fVar47 = fVar47 + pfVar1[2] * fVar5;
          fVar52 = fVar52 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2 * 2;
          fVar28 = fVar28 + *pfVar1 * fVar3;
          fVar29 = fVar29 + pfVar1[1] * fVar4;
          fVar30 = fVar30 + pfVar1[2] * fVar5;
          fVar31 = fVar31 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2 * 3;
          fVar32 = fVar32 + *pfVar1 * fVar3;
          fVar33 = fVar33 + pfVar1[1] * fVar4;
          fVar34 = fVar34 + pfVar1[2] * fVar5;
          fVar35 = fVar35 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2 * 4;
          fVar36 = fVar36 + *pfVar1 * fVar3;
          fVar38 = fVar38 + pfVar1[1] * fVar4;
          fVar39 = fVar39 + pfVar1[2] * fVar5;
          fVar40 = fVar40 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2 * 5;
          fVar41 = fVar41 + *pfVar1 * fVar3;
          fVar43 = fVar43 + pfVar1[1] * fVar4;
          fVar44 = fVar44 + pfVar1[2] * fVar5;
          fVar45 = fVar45 + pfVar1[3] * fVar6;
          pfVar1 = pfVar21 + lVar15 + lVar2 * 6;
          pfVar7 = pfVar21 + lVar15 + lVar2 * 7;
          fVar46 = fVar46 + *pfVar1 * fVar3;
          fVar48 = fVar48 + pfVar1[1] * fVar4;
          fVar49 = fVar49 + pfVar1[2] * fVar5;
          fVar50 = fVar50 + pfVar1[3] * fVar6;
          fVar51 = fVar51 + *pfVar7 * fVar3;
          fVar53 = fVar53 + pfVar7[1] * fVar4;
          fVar54 = fVar54 + pfVar7[2] * fVar5;
          fVar55 = fVar55 + pfVar7[3] * fVar6;
          lVar10 = lVar15 + 4;
          lVar13 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar13 <= cols);
      }
      fVar24 = fVar27 + fVar25 + fVar26 + fVar24;
      fVar25 = fVar52 + fVar42 + fVar47 + fVar37;
      fVar26 = fVar31 + fVar29 + fVar30 + fVar28;
      fVar27 = fVar35 + fVar33 + fVar34 + fVar32;
      fVar37 = fVar40 + fVar38 + fVar39 + fVar36;
      fVar42 = fVar45 + fVar43 + fVar44 + fVar41;
      fVar47 = fVar50 + fVar48 + fVar49 + fVar46;
      fVar52 = fVar55 + fVar53 + fVar54 + fVar51;
      if (lVar10 < cols) {
        lVar15 = 0;
        do {
          fVar28 = pfVar22[lVar10 + lVar15];
          fVar24 = fVar24 + pfVar21[lVar10 + lVar15] * fVar28;
          fVar25 = fVar25 + local_78[lVar10 + lVar15] * fVar28;
          fVar26 = fVar26 + local_70[lVar10 + lVar15] * fVar28;
          fVar27 = fVar27 + local_68[lVar10 + lVar15] * fVar28;
          fVar37 = fVar37 + pfVar18[lVar10 + lVar15] * fVar28;
          fVar42 = fVar42 + pfVar11[lVar10 + lVar15] * fVar28;
          fVar47 = fVar47 + pfVar9[lVar10 + lVar15] * fVar28;
          fVar52 = fVar52 + fVar28 * pfVar12[lVar10 + lVar15];
          lVar15 = lVar15 + 1;
        } while (cols - lVar10 != lVar15);
      }
      lVar23 = uVar8 * resIncr;
      lVar10 = (uVar8 | 1) * resIncr;
      lVar17 = (uVar8 | 2) * resIncr;
      lVar16 = (uVar8 | 3) * resIncr;
      lVar19 = (uVar8 | 4) * resIncr;
      lVar20 = (uVar8 | 5) * resIncr;
      lVar13 = (uVar8 | 6) * resIncr;
      lVar15 = (uVar8 | 7) * resIncr;
      uVar8 = uVar8 + 8;
      res[lVar23] = fVar24 * alpha + res[lVar23];
      res[lVar10] = fVar25 * alpha + res[lVar10];
      res[lVar17] = fVar26 * alpha + res[lVar17];
      res[lVar16] = fVar27 * alpha + res[lVar16];
      res[lVar19] = fVar37 * alpha + res[lVar19];
      res[lVar20] = fVar42 * alpha + res[lVar20];
      res[lVar13] = fVar47 * alpha + res[lVar13];
      res[lVar15] = fVar52 * alpha + res[lVar15];
      if (32000 < (ulong)(lVar2 * 4)) break;
      pfVar21 = pfVar21 + lVar2 * 8;
      pfVar12 = pfVar12 + lVar2 * 8;
      pfVar9 = pfVar9 + lVar2 * 8;
      pfVar11 = pfVar11 + lVar2 * 8;
      pfVar18 = pfVar18 + lVar2 * 8;
      local_68 = local_68 + lVar2 * 8;
      local_70 = local_70 + lVar2 * 8;
      local_78 = local_78 + lVar2 * 8;
    } while ((long)uVar8 < rows + -7);
  }
  if ((long)uVar8 < rows + -3) {
    pfVar12 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar9 = pfVar14 + (uVar8 + 3) * lVar2;
    pfVar11 = pfVar14 + (uVar8 + 2) * lVar2;
    pfVar22 = pfVar14 + (uVar8 + 1) * lVar2;
    pfVar21 = pfVar14 + uVar8 * lVar2;
    do {
      if (cols < 4) {
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        lVar15 = 0;
        do {
          pfVar18 = pfVar12 + lVar15;
          fVar36 = *pfVar18;
          fVar38 = pfVar18[1];
          fVar39 = pfVar18[2];
          fVar40 = pfVar18[3];
          pfVar18 = pfVar21 + lVar15;
          fVar24 = fVar24 + *pfVar18 * fVar36;
          fVar25 = fVar25 + pfVar18[1] * fVar38;
          fVar26 = fVar26 + pfVar18[2] * fVar39;
          fVar27 = fVar27 + pfVar18[3] * fVar40;
          pfVar18 = pfVar22 + lVar15;
          fVar37 = fVar37 + *pfVar18 * fVar36;
          fVar42 = fVar42 + pfVar18[1] * fVar38;
          fVar47 = fVar47 + pfVar18[2] * fVar39;
          fVar52 = fVar52 + pfVar18[3] * fVar40;
          pfVar18 = pfVar11 + lVar15;
          fVar28 = fVar28 + *pfVar18 * fVar36;
          fVar29 = fVar29 + pfVar18[1] * fVar38;
          fVar30 = fVar30 + pfVar18[2] * fVar39;
          fVar31 = fVar31 + pfVar18[3] * fVar40;
          pfVar18 = pfVar9 + lVar15;
          fVar32 = fVar32 + *pfVar18 * fVar36;
          fVar33 = fVar33 + pfVar18[1] * fVar38;
          fVar34 = fVar34 + pfVar18[2] * fVar39;
          fVar35 = fVar35 + pfVar18[3] * fVar40;
          lVar10 = lVar15 + 4;
          lVar13 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar13 <= cols);
      }
      fVar24 = fVar27 + fVar25 + fVar26 + fVar24;
      fVar25 = fVar52 + fVar42 + fVar47 + fVar37;
      fVar26 = fVar31 + fVar29 + fVar30 + fVar28;
      fVar27 = fVar35 + fVar33 + fVar34 + fVar32;
      if (lVar10 < cols) {
        lVar15 = 0;
        do {
          fVar37 = pfVar12[lVar10 + lVar15];
          fVar24 = fVar24 + pfVar21[lVar10 + lVar15] * fVar37;
          fVar25 = fVar25 + pfVar22[lVar10 + lVar15] * fVar37;
          fVar26 = fVar26 + pfVar11[lVar10 + lVar15] * fVar37;
          fVar27 = fVar27 + fVar37 * pfVar9[lVar10 + lVar15];
          lVar15 = lVar15 + 1;
        } while (cols - lVar10 != lVar15);
      }
      res[uVar8 * resIncr] = fVar24 * alpha + res[uVar8 * resIncr];
      lVar15 = (uVar8 + 1) * resIncr;
      res[lVar15] = fVar25 * alpha + res[lVar15];
      lVar15 = (uVar8 + 2) * resIncr;
      res[lVar15] = fVar26 * alpha + res[lVar15];
      lVar15 = (uVar8 + 3) * resIncr;
      res[lVar15] = fVar27 * alpha + res[lVar15];
      uVar8 = uVar8 + 4;
      pfVar9 = pfVar9 + lVar2 * 4;
      pfVar11 = pfVar11 + lVar2 * 4;
      pfVar22 = pfVar22 + lVar2 * 4;
      pfVar21 = pfVar21 + lVar2 * 4;
    } while ((long)uVar8 < rows + -3);
  }
  if ((long)uVar8 < rows + -1) {
    pfVar22 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar9 = pfVar14 + (uVar8 + 1) * lVar2;
    pfVar11 = pfVar14 + uVar8 * lVar2;
    do {
      if (cols < 4) {
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar52 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        lVar15 = 0;
        do {
          pfVar21 = pfVar22 + lVar15;
          pfVar12 = pfVar11 + lVar15;
          fVar24 = fVar24 + *pfVar12 * *pfVar21;
          fVar25 = fVar25 + pfVar12[1] * pfVar21[1];
          fVar26 = fVar26 + pfVar12[2] * pfVar21[2];
          fVar27 = fVar27 + pfVar12[3] * pfVar21[3];
          pfVar12 = pfVar9 + lVar15;
          fVar37 = fVar37 + *pfVar12 * *pfVar21;
          fVar42 = fVar42 + pfVar12[1] * pfVar21[1];
          fVar47 = fVar47 + pfVar12[2] * pfVar21[2];
          fVar52 = fVar52 + pfVar12[3] * pfVar21[3];
          lVar10 = lVar15 + 4;
          lVar13 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar13 <= cols);
      }
      fVar24 = fVar27 + fVar25 + fVar26 + fVar24;
      fVar25 = fVar52 + fVar42 + fVar47 + fVar37;
      if (lVar10 < cols) {
        do {
          fVar26 = pfVar22[lVar10];
          fVar24 = fVar24 + pfVar11[lVar10] * fVar26;
          fVar25 = fVar25 + fVar26 * pfVar9[lVar10];
          lVar10 = lVar10 + 1;
        } while (cols != lVar10);
      }
      res[uVar8 * resIncr] = fVar24 * alpha + res[uVar8 * resIncr];
      lVar15 = (uVar8 + 1) * resIncr;
      res[lVar15] = fVar25 * alpha + res[lVar15];
      uVar8 = uVar8 + 2;
      pfVar9 = pfVar9 + lVar2 * 2;
      pfVar11 = pfVar11 + lVar2 * 2;
    } while ((long)uVar8 < rows + -1);
  }
  if ((long)uVar8 < rows) {
    pfVar9 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar14 = pfVar14 + lVar2 * uVar8;
    do {
      fVar24 = 0.0;
      fVar25 = 0.0;
      fVar26 = 0.0;
      fVar27 = 0.0;
      if (cols < 4) {
        lVar10 = 0;
      }
      else {
        lVar15 = 0;
        do {
          pfVar11 = pfVar9 + lVar15;
          pfVar22 = pfVar14 + lVar15;
          fVar24 = fVar24 + *pfVar22 * *pfVar11;
          fVar25 = fVar25 + pfVar22[1] * pfVar11[1];
          fVar26 = fVar26 + pfVar22[2] * pfVar11[2];
          fVar27 = fVar27 + pfVar22[3] * pfVar11[3];
          lVar10 = lVar15 + 4;
          lVar13 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar13 <= cols);
      }
      fVar24 = fVar27 + fVar25 + fVar26 + fVar24;
      if (lVar10 < cols) {
        do {
          fVar24 = fVar24 + pfVar14[lVar10] * pfVar9[lVar10];
          lVar10 = lVar10 + 1;
        } while (cols != lVar10);
      }
      res[uVar8 * resIncr] = fVar24 * alpha + res[uVar8 * resIncr];
      uVar8 = uVar8 + 1;
      pfVar14 = pfVar14 + lVar2;
    } while (uVar8 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}